

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O2

int main(void)

{
  P *pPVar1;
  P *pPVar2;
  P *pPVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined1 local_2d0 [8];
  P searchRectMax;
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  undefined1 local_1c0 [8];
  KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> tree;
  undefined1 local_190 [8];
  P searchRectMin;
  P p5;
  P p4;
  vector<P_*,_std::allocator<P_*>_> result;
  vector<P_*,_std::allocator<P_*>_> values;
  undefined1 local_c8 [8];
  P p3;
  P p1;
  P p2;
  
  pPVar1 = (P *)(p1.d2.field_2._M_local_buf + 8);
  std::__cxx11::string::string
            ((string *)(searchRectMax.d2.field_2._M_local_buf + 8),"a",(allocator *)pPVar1);
  p3.d2.field_2._8_4_ = 0;
  p1.d0 = 0;
  p1._4_4_ = 0x40000000;
  std::__cxx11::string::string
            ((string *)&p1.d1,(string *)(searchRectMax.d2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(searchRectMax.d2.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_280,"b",(allocator *)local_c8);
  p1.d2.field_2._8_4_ = 1;
  p2.d0 = 0;
  p2._4_4_ = 0x40000000;
  std::__cxx11::string::string((string *)&p2.d1,local_280);
  std::__cxx11::string::~string(local_280);
  pPVar2 = (P *)(p5.d2.field_2._M_local_buf + 8);
  std::__cxx11::string::string(local_260,"c",(allocator *)pPVar2);
  local_c8._0_4_ = 1;
  p3.d0 = 0;
  p3._4_4_ = 0x40000000;
  std::__cxx11::string::string((string *)&p3.d1,local_260);
  std::__cxx11::string::~string(local_260);
  pPVar3 = (P *)(searchRectMin.d2.field_2._M_local_buf + 8);
  std::__cxx11::string::string(local_240,"d",(allocator *)pPVar3);
  p5.d2.field_2._8_4_ = 1;
  p4.d0 = 0;
  p4._4_4_ = 0x401c0000;
  std::__cxx11::string::string((string *)&p4.d1,local_240);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::string(local_220,"e",(allocator *)local_190);
  searchRectMin.d2.field_2._8_4_ = 1;
  p5.d0 = 0;
  p5._4_4_ = 0x40000000;
  std::__cxx11::string::string((string *)&p5.d1,local_220);
  std::__cxx11::string::~string(local_220);
  result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_190 = (undefined1  [8])((long)&p3.d2.field_2 + 8);
  std::vector<P*,std::allocator<P*>>::emplace_back<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(P **)local_190);
  local_190 = (undefined1  [8])pPVar1;
  std::vector<P*,std::allocator<P*>>::emplace_back<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(P **)local_190);
  local_190 = (undefined1  [8])local_c8;
  std::vector<P*,std::allocator<P*>>::emplace_back<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(P **)local_190);
  local_190 = (undefined1  [8])pPVar2;
  std::vector<P*,std::allocator<P*>>::emplace_back<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(P **)local_190);
  local_190 = (undefined1  [8])pPVar3;
  std::vector<P*,std::allocator<P*>>::emplace_back<P*>
            ((vector<P*,std::allocator<P*>> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(P **)local_190);
  std::vector<P_*,_std::allocator<P_*>_>::vector
            ((vector<P_*,_std::allocator<P_*>_> *)&tree.boundingBoxMax,
             (vector<P_*,_std::allocator<P_*>_> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::KDTree
            ((KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_1c0,
             (vector<P_*,_std::allocator<P_*>_> *)&tree.boundingBoxMax);
  std::_Vector_base<P_*,_std::allocator<P_*>_>::~_Vector_base
            ((_Vector_base<P_*,_std::allocator<P_*>_> *)&tree.boundingBoxMax);
  std::__cxx11::string::string(local_200,"b",(allocator *)local_2d0);
  local_190 = (undefined1  [8])((ulong)local_190 & 0xffffffff00000000);
  searchRectMin.d0 = 0;
  searchRectMin._4_4_ = 0;
  std::__cxx11::string::string((string *)&searchRectMin.d1,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::string(local_1e0,"d",(allocator *)(p4.d2.field_2._M_local_buf + 8));
  local_2d0._0_4_ = 2;
  searchRectMax.d0 = 0;
  searchRectMax._4_4_ = 0x40180000;
  std::__cxx11::string::string((string *)&searchRectMax.d1,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
            ((vector<P_*,_std::allocator<P_*>_> *)((long)&p4.d2.field_2 + 8),
             (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_1c0,(P *)local_190,
             (P *)local_2d0);
  poVar4 = std::operator<<((ostream *)&std::cout,"found ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," entries:");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar5 = p4.d2.field_2._8_8_;
      (pointer)uVar5 !=
      result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 8) {
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(*(P **)uVar5)->d0);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>((*(P **)uVar5)->d1);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)&(*(P **)uVar5)->d2);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::_Vector_base<P_*,_std::allocator<P_*>_>::~_Vector_base
            ((_Vector_base<P_*,_std::allocator<P_*>_> *)((long)&p4.d2.field_2 + 8));
  std::__cxx11::string::~string((string *)&searchRectMax.d1);
  std::__cxx11::string::~string((string *)&searchRectMin.d1);
  kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::~KDTree
            ((KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *)local_1c0);
  std::_Vector_base<P_*,_std::allocator<P_*>_>::~_Vector_base
            ((_Vector_base<P_*,_std::allocator<P_*>_> *)
             &result.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::__cxx11::string::~string((string *)&p5.d1);
  std::__cxx11::string::~string((string *)&p4.d1);
  std::__cxx11::string::~string((string *)&p3.d1);
  std::__cxx11::string::~string((string *)&p2.d1);
  std::__cxx11::string::~string((string *)&p1.d1);
  return 1;
}

Assistant:

int main() {
	// prepare elements, three dimensional P objects
	P p1(0, 2, "a");
	P p2(1, 2, "b");
	P p3(1, 2, "c");
	P p4(1, 7, "d");
	P p5(1, 2, "e");

	// prepare the entries
	std::vector<P*> values;
	values.push_back(&p1);
	values.push_back(&p2);
	values.push_back(&p3);
	values.push_back(&p4);
	values.push_back(&p5);

	// the tree uses default implementations of new, delete, set and less for arrays.
	// since we don't use arrays, but the custom type P, we need to pass the functors we defined above to enable the tree to work with P
	kdtree::KDTree<P, dim, P_new, P_delete, P_set, P_less> tree(values);

	// prepare search query.
	// we search for P objects that match these criterias:
	//	d0 >= 0, d0 <= 2
	//	d1 >= 0, d1 <= 6
	//	d2 >= "b", d2 <= "d"
	P searchRectMin(0, 0, "b");
	P searchRectMax(2, 6, "d");

	// perform the search. result will contain the elements that match the query.
	std::vector<P*> result = tree.queryRectangle(&searchRectMin, &searchRectMax);

	// print results
	std::cout << "found " << result.size() << " entries:" << std::endl;
	for (std::vector<P*>::const_iterator it = result.begin(); it != result.end(); ++it) {
		std::cout << (*it)->d0 << " " << (*it)->d1 << " " << (*it)->d2 << std::endl;
	}

	return 1;
}